

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O0

ZyanStatus ZyanVectorDestroy(ZyanVector *vector)

{
  ZyanStatus ZVar1;
  ulong uStack_20;
  ZyanStatus status_047620348;
  ZyanUSize i;
  ZyanVector *vector_local;
  
  if (vector == (ZyanVector *)0x0) {
    vector_local._4_4_ = 0x80100004;
  }
  else {
    if (vector->element_size == 0) {
      __assert_fail("vector->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                    ,0xf3,"ZyanStatus ZyanVectorDestroy(ZyanVector *)");
    }
    if (vector->data == (void *)0x0) {
      __assert_fail("vector->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                    ,0xf4,"ZyanStatus ZyanVectorDestroy(ZyanVector *)");
    }
    if (vector->destructor != (ZyanMemberProcedure)0x0) {
      for (uStack_20 = 0; uStack_20 < vector->size; uStack_20 = uStack_20 + 1) {
        (*vector->destructor)((void *)((long)vector->data + uStack_20 * vector->element_size));
      }
    }
    if ((vector->allocator != (ZyanAllocator *)0x0) && (vector->capacity != 0)) {
      if (vector->allocator->deallocate == (ZyanAllocatorDeallocate)0x0) {
        __assert_fail("vector->allocator->deallocate",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/dependencies/zycore/src/Vector.c"
                      ,0x100,"ZyanStatus ZyanVectorDestroy(ZyanVector *)");
      }
      ZVar1 = (*vector->allocator->deallocate)
                        (vector->allocator,vector->data,vector->element_size,vector->capacity);
      if ((ZVar1 & 0x80000000) != 0) {
        return ZVar1;
      }
    }
    vector->data = (void *)0x0;
    vector_local._4_4_ = 0x100000;
  }
  return vector_local._4_4_;
}

Assistant:

ZyanStatus ZyanVectorDestroy(ZyanVector* vector)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    if (vector->destructor)
    {
        for (ZyanUSize i = 0; i < vector->size; ++i)
        {
            vector->destructor(ZYCORE_VECTOR_OFFSET(vector, i));
        }
    }

    if (vector->allocator && vector->capacity)
    {
        ZYAN_ASSERT(vector->allocator->deallocate);
        ZYAN_CHECK(vector->allocator->deallocate(vector->allocator, vector->data,
            vector->element_size, vector->capacity));
    }

    vector->data = ZYAN_NULL;
    return ZYAN_STATUS_SUCCESS;
}